

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

char * luaL_optlstring(lua_State *L,int idx,char *def,size_t *len)

{
  TValue *pTVar1;
  size_t sVar2;
  GCstr *pGVar3;
  size_t *in_RCX;
  char *in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  GCstr *s;
  TValue *o;
  cTValue *in_stack_ffffffffffffff58;
  lua_State *in_stack_ffffffffffffff60;
  
  pTVar1 = index2adr(in_RDI,in_ESI);
  if ((pTVar1->field_2).it == 0xfffffffb) {
    pGVar3 = (GCstr *)(ulong)(pTVar1->u32).lo;
  }
  else {
    if ((pTVar1->field_2).it == 0xffffffff) {
      if (in_RCX == (size_t *)0x0) {
        return in_RDX;
      }
      if (in_RDX == (char *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = strlen(in_RDX);
      }
      *in_RCX = sVar2;
      return in_RDX;
    }
    if (0xfffeffff < (pTVar1->field_2).it) {
      lj_err_argt(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                  (int)in_stack_ffffffffffffff58);
    }
    if (*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x54) <=
        *(uint *)((ulong)(in_RDI->glref).ptr32 + 0x50)) {
      lj_gc_step((lua_State *)&pTVar1->field_2);
    }
    pTVar1 = index2adr(in_RDI,in_ESI);
    pGVar3 = lj_strfmt_number(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    (pTVar1->u32).lo = (uint32_t)pGVar3;
    (pTVar1->field_2).it = 0xfffffffb;
  }
  if (in_RCX != (size_t *)0x0) {
    *in_RCX = (ulong)pGVar3->len;
  }
  return (char *)(pGVar3 + 1);
}

Assistant:

LUALIB_API const char *luaL_optlstring(lua_State *L, int idx,
				       const char *def, size_t *len)
{
  TValue *o = index2adr(L, idx);
  GCstr *s;
  if (LJ_LIKELY(tvisstr(o))) {
    s = strV(o);
  } else if (tvisnil(o)) {
    if (len != NULL) *len = def ? strlen(def) : 0;
    return def;
  } else if (tvisnumber(o)) {
    lj_gc_check(L);
    o = index2adr(L, idx);  /* GC may move the stack. */
    s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
  } else {
    lj_err_argt(L, idx, LUA_TSTRING);
  }
  if (len != NULL) *len = s->len;
  return strdata(s);
}